

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O3

int ddGroupSiftingBackward(DdManager *table,Move *moves,int size,int upFlag,int lazyFlag)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint x;
  uint uVar7;
  uint uVar8;
  Move *pMVar9;
  DdSubtable *pDVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  Move *pMVar14;
  Move *pMVar15;
  int x_00;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  bool bVar19;
  
  if (lazyFlag == 0) {
    if (moves == (Move *)0x0) {
      return 1;
    }
    pMVar15 = (Move *)0x0;
    pMVar9 = moves;
    do {
      if (pMVar9->size < size) {
        size = pMVar9->size;
      }
      pMVar9 = pMVar9->next;
    } while (pMVar9 != (Move *)0x0);
  }
  else {
    if (moves == (Move *)0x0) {
      return 1;
    }
    pMVar15 = (Move *)0x0;
    pMVar9 = moves;
    do {
      iVar2 = pMVar9->size;
      pMVar14 = pMVar15;
      if (pMVar15 == (Move *)0x0) {
        pMVar14 = pMVar9;
      }
      if (iVar2 == size) {
        pMVar15 = pMVar14;
      }
      if (iVar2 < size) {
        size = iVar2;
        pMVar15 = pMVar9;
      }
      pMVar9 = pMVar9->next;
    } while (pMVar9 != (Move *)0x0);
    if (moves == (Move *)0x0) {
      return 1;
    }
    iVar2 = Cudd_ReadSize(table);
    iVar2 = iVar2 + 1;
    piVar1 = table->perm;
    iVar3 = Cudd_bddReadPairIndex(table,table->invperm[(&moves->x)[upFlag != 1]]);
    uVar6 = piVar1[iVar3];
    pMVar9 = moves;
    do {
      if (pMVar9->size == size) {
        uVar8 = (&pMVar9->x)[upFlag != 1];
        iVar3 = uVar6 - uVar8;
        if (uVar6 < uVar8) {
          iVar3 = -(uVar6 - uVar8);
        }
        if (iVar3 < iVar2) {
          pMVar15 = pMVar9;
          iVar2 = iVar3;
        }
      }
      pMVar9 = pMVar9->next;
    } while (pMVar9 != (Move *)0x0);
  }
  if (moves != (Move *)0x0) {
    do {
      if (lazyFlag == 0) {
        if (moves->size == size) {
          return 1;
        }
      }
      else if (moves == pMVar15) {
        return 1;
      }
      pDVar10 = table->subtables;
      uVar6 = moves->x;
      uVar16 = (ulong)uVar6;
      if ((pDVar10[uVar16].next == uVar6) && (uVar8 = moves->y, pDVar10[uVar8].next == uVar8)) {
        iVar2 = cuddSwapInPlace(table,uVar6,uVar8);
        if (iVar2 == 0) {
          return 0;
        }
      }
      else {
        uVar8 = moves->y;
        uVar17 = (ulong)uVar8;
        if (moves->flags == 8) {
          do {
            uVar11 = (uint)uVar17;
            uVar7 = pDVar10[(int)uVar11].next;
            uVar17 = (ulong)uVar7;
          } while (uVar11 < uVar7);
          pDVar10[(int)uVar11].next = uVar8;
        }
        else {
          uVar7 = pDVar10[(int)uVar6].next;
          uVar13 = uVar17;
          do {
            uVar11 = (uint)uVar13;
            uVar13 = (ulong)pDVar10[(int)uVar11].next;
          } while (uVar11 < pDVar10[(int)uVar11].next);
          iVar2 = uVar6 - uVar7;
          iVar3 = uVar11 - uVar8;
          x = uVar7;
          if (-1 < iVar3) {
            iVar12 = 1;
            do {
              iVar18 = (uVar6 - uVar7) + 1;
              if (-1 < iVar2) {
                do {
                  uVar13 = uVar16;
                  x_00 = (int)uVar13;
                  iVar4 = cuddSwapInPlace(table,x_00,(int)uVar17);
                  if (iVar4 == 0) {
                    return 0;
                  }
                  uVar5 = cuddNextLow(table,x_00);
                  iVar18 = iVar18 + -1;
                  uVar16 = (ulong)uVar5;
                  uVar17 = uVar13;
                } while (iVar18 != 0);
              }
              uVar17 = (ulong)(iVar12 + uVar8);
              uVar5 = cuddNextLow(table,iVar12 + uVar8);
              uVar16 = (ulong)uVar5;
              bVar19 = iVar12 != iVar3 + 1;
              iVar12 = iVar12 + 1;
            } while (bVar19);
            if (uVar11 != uVar8) {
              do {
                uVar6 = cuddNextHigh(table,x);
                table->subtables[(int)x].next = uVar6;
                x = cuddNextHigh(table,x);
                iVar3 = iVar3 + -1;
              } while (iVar3 != 0);
            }
          }
          table->subtables[(int)x].next = uVar7;
          uVar7 = cuddNextHigh(table,x);
          uVar6 = uVar7;
          if (0 < iVar2) {
            do {
              uVar8 = cuddNextHigh(table,uVar6);
              table->subtables[(int)uVar6].next = uVar8;
              uVar6 = cuddNextHigh(table,uVar6);
              iVar2 = iVar2 + -1;
            } while (iVar2 != 0);
          }
          pDVar10 = table->subtables;
        }
        pDVar10[(int)uVar6].next = uVar7;
      }
      moves = moves->next;
    } while (moves != (Move *)0x0);
  }
  return 1;
}

Assistant:

static int
ddGroupSiftingBackward(
  DdManager * table,
  Move * moves,
  int  size,
  int  upFlag,
  int  lazyFlag)
{
    Move *move;
    int  res;
    Move *end_move = NULL;
    int diff, tmp_diff;
    int index;
    unsigned int pairlev;

    if (lazyFlag) {
        end_move = NULL;

        /* Find the minimum size, and the earliest position at which it
        ** was achieved. */
        for (move = moves; move != NULL; move = move->next) {
            if (move->size < size) {
                size = move->size;
                end_move = move;
            } else if (move->size == size) {
                if (end_move == NULL) end_move = move;
            }
        }

        /* Find among the moves that give minimum size the one that
        ** minimizes the distance from the corresponding variable. */
        if (moves != NULL) {
            diff = Cudd_ReadSize(table) + 1;
            index = (upFlag == 1) ?
                    table->invperm[moves->x] : table->invperm[moves->y];
            pairlev =
                (unsigned) table->perm[Cudd_bddReadPairIndex(table, index)];

            for (move = moves; move != NULL; move = move->next) {
                if (move->size == size) {
                    if (upFlag == 1) {
                        tmp_diff = (move->x > pairlev) ?
                                    move->x - pairlev : pairlev - move->x;
                    } else {
                        tmp_diff = (move->y > pairlev) ?
                                    move->y - pairlev : pairlev - move->y;
                    }
                    if (tmp_diff < diff) {
                        diff = tmp_diff;
                        end_move = move;
                    }
                }
            }
        }
    } else {
        /* Find the minimum size. */
        for (move = moves; move != NULL; move = move->next) {
            if (move->size < size) {
                size = move->size;
            }
        }
    }

    /* In case of lazy sifting, end_move identifies the position at
    ** which we want to stop.  Otherwise, we stop as soon as we meet
    ** the minimum size. */
    for (move = moves; move != NULL; move = move->next) {
        if (lazyFlag) {
            if (move == end_move) return(1);
        } else {
            if (move->size == size) return(1);
        }
        if ((table->subtables[move->x].next == move->x) &&
        (table->subtables[move->y].next == move->y)) {
            res = cuddSwapInPlace(table,(int)move->x,(int)move->y);
            if (!res) return(0);
#ifdef DD_DEBUG
            if (pr > 0) (void) fprintf(table->out,"ddGroupSiftingBackward:\n");
            assert(table->subtables[move->x].next == move->x);
            assert(table->subtables[move->y].next == move->y);
#endif
        } else { /* Group move necessary */
            if (move->flags == MTR_NEWNODE) {
                ddDissolveGroup(table,(int)move->x,(int)move->y);
            } else {
                res = ddGroupMoveBackward(table,(int)move->x,(int)move->y);
                if (!res) return(0);
            }
        }

    }

    return(1);

}